

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O2

void writePrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,char *filename,NameSet *colnames,NameSet *rownames,bool real,bool rational,
               bool append)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  int iVar2;
  pointer pnVar3;
  bool bVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  int i_3;
  uint *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  undefined3 in_register_00000081;
  int i_1;
  long lVar10;
  int i_2;
  int i;
  long lVar11;
  byte bVar12;
  Real RVar13;
  double dVar14;
  VectorRational primal_1;
  int local_3a4;
  longlong local_398;
  undefined4 local_38c;
  double local_388;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  ofstream outfile;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_328 [63];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  local_38c = CONCAT31(in_register_00000081,real);
  bVar12 = 0;
  psVar1 = &soplex->_tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&outfile,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar13 = ::soplex::Tolerances::epsilon(_outfile);
  local_388 = log10(RVar13);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_328);
  std::ofstream::ofstream(&outfile);
  std::ofstream::open((char *)&outfile,(_Ios_Openmode)filename);
  dVar14 = -local_388;
  local_388 = (double)(long)((int)dVar14 + 10);
  lVar5 = (long)(int)dVar14;
  if ((char)rownames == '\0') goto LAB_00134fa5;
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&primal,(soplex->_realLP->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
  bVar4 = ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getPrimalRay(soplex,&primal);
  if (bVar4) {
    std::operator<<((ostream *)&outfile,"\nPrimal ray (name, value):\n");
    lVar10 = 0;
    for (lVar11 = 0;
        lVar11 < (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum; lVar11 = lVar11 + 1) {
      puVar8 = (uint *)((long)((primal.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar10);
      pnVar9 = &local_b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = *puVar8;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp =
           *(int *)((long)(&((primal.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                   lVar10);
      local_b0.m_backend.neg =
           *(bool *)((long)(&((primal.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                    lVar10 + 4);
      local_b0.m_backend._120_8_ =
           *(undefined8 *)
            ((long)(&((primal.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) + lVar10 + 8
            );
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar13 = ::soplex::Tolerances::epsilon
                         ((Tolerances *)
                          primal_1.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      bVar4 = ::soplex::
              isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_b0,RVar13);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &primal_1.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar4) {
        poVar6 = std::operator<<((ostream *)&outfile,
                                 colnames->mem +
                                 (colnames->set).theitem[(colnames->set).thekey[lVar11].idx].data);
        poVar6 = std::operator<<(poVar6,"\t");
        lVar7 = *(long *)poVar6;
        *(double *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = local_388;
        *(long *)(poVar6 + *(long *)(lVar7 + -0x18) + 8) = lVar5;
        poVar6 = boost::multiprecision::operator<<
                           (poVar6,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)((long)((primal.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_backend
                                             ).data._M_elems + lVar10));
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      lVar10 = lVar10 + 0x80;
    }
    poVar6 = std::operator<<((ostream *)&outfile,"All other entries are zero (within ");
    lVar10 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 8) = 1;
    lVar10 = *(long *)(lVar10 + -0x18);
    *(uint *)(poVar6 + lVar10 + 0x18) = *(uint *)(poVar6 + lVar10 + 0x18) & 0xfffffefb | 0x100;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar13 = ::soplex::Tolerances::epsilon
                       ((Tolerances *)
                        primal_1.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::ostream::_M_insert<double>(RVar13);
    lVar10 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 8) = 8;
    lVar10 = *(long *)(lVar10 + -0x18);
    *(uint *)(poVar6 + lVar10 + 0x18) = *(uint *)(poVar6 + lVar10 + 0x18) & 0xfffffefb | 4;
    poVar6 = std::operator<<(poVar6,").");
    std::endl<char,std::char_traits<char>>(poVar6);
LAB_00134f7b:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &primal_1.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    bVar4 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(soplex);
    if ((bVar4) &&
       (bVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimal(soplex,&primal), bVar4)) {
      std::operator<<((ostream *)&outfile,"\nPrimal solution (name, value):\n");
      lVar10 = 0;
      local_3a4 = 0;
      for (lVar11 = 0;
          lVar11 < (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar11 = lVar11 + 1) {
        puVar8 = (uint *)((long)((primal.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + lVar10);
        pnVar9 = &local_130;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = *puVar8;
          puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
        }
        local_130.m_backend.exp =
             *(int *)((long)(&((primal.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                     lVar10);
        local_130.m_backend.neg =
             *(bool *)((long)(&((primal.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                      lVar10 + 4);
        local_130.m_backend._120_8_ =
             *(undefined8 *)
              ((long)(&((primal.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
              lVar10 + 8);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar13 = ::soplex::Tolerances::epsilon
                           ((Tolerances *)
                            primal_1.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        bVar4 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_130,RVar13);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &primal_1.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        if (bVar4) {
          poVar6 = std::operator<<((ostream *)&outfile,
                                   colnames->mem +
                                   (colnames->set).theitem[(colnames->set).thekey[lVar11].idx].data)
          ;
          poVar6 = std::operator<<(poVar6,"\t");
          lVar7 = *(long *)poVar6;
          *(double *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = local_388;
          *(long *)(poVar6 + *(long *)(lVar7 + -0x18) + 8) = lVar5;
          poVar6 = boost::multiprecision::operator<<
                             (poVar6,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)((long)((primal.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               m_backend).data._M_elems + lVar10));
          std::endl<char,std::char_traits<char>>(poVar6);
          local_3a4 = local_3a4 + 1;
        }
        lVar10 = lVar10 + 0x80;
      }
      poVar6 = std::operator<<((ostream *)&outfile,"All other variables are zero (within ");
      lVar10 = *(long *)poVar6;
      *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 8) = 1;
      lVar10 = *(long *)(lVar10 + -0x18);
      *(uint *)(poVar6 + lVar10 + 0x18) = *(uint *)(poVar6 + lVar10 + 0x18) & 0xfffffefb | 0x100;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&primal_1,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar13 = ::soplex::Tolerances::epsilon
                         ((Tolerances *)
                          primal_1.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      poVar6 = std::ostream::_M_insert<double>(RVar13);
      lVar10 = *(long *)poVar6;
      *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 8) = 8;
      lVar10 = *(long *)(lVar10 + -0x18);
      *(uint *)(poVar6 + lVar10 + 0x18) = *(uint *)(poVar6 + lVar10 + 0x18) & 0xfffffefb | 4;
      poVar6 = std::operator<<(poVar6,"). Solution has ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_3a4);
      poVar6 = std::operator<<(poVar6," nonzero entries.");
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_00134f7b;
    }
    std::operator<<((ostream *)&outfile,"No primal information available.\n");
  }
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)&primal);
LAB_00134fa5:
  if ((char)local_38c != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase(&primal_1,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar4 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational(soplex,&primal_1);
    if (bVar4) {
      std::operator<<((ostream *)&outfile,"\nPrimal ray (name, value):\n");
      lVar10 = 0;
      for (lVar11 = 0;
          pnVar3 = primal_1.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar11 < (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar11 = lVar11 + 1) {
        local_398 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&primal,&local_398,(type *)0x0);
        bVar4 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)((long)&(pnVar3->m_backend).m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar10),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&primal);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&primal);
        if (bVar4) {
          poVar6 = std::operator<<((ostream *)&outfile,
                                   colnames->mem +
                                   (colnames->set).theitem[(colnames->set).thekey[lVar11].idx].data)
          ;
          poVar6 = std::operator<<(poVar6,"\t");
          lVar7 = *(long *)poVar6;
          *(double *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = local_388;
          *(long *)(poVar6 + *(long *)(lVar7 + -0x18) + 8) = lVar5;
          poVar6 = boost::multiprecision::operator<<
                             (poVar6,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)((long)&((primal_1.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                m_backend).m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar10));
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        lVar10 = lVar10 + 0x40;
      }
      poVar6 = std::operator<<((ostream *)&outfile,"All other entries are zero.");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    bVar4 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(soplex);
    if ((bVar4) &&
       (bVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(soplex,&primal_1), bVar4)) {
      std::operator<<((ostream *)&outfile,"\nPrimal solution (name, value):\n");
      lVar10 = 0;
      iVar2 = 0;
      for (lVar5 = 0;
          pnVar3 = primal_1.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar5 < (soplex->_rationalLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .set.thenum; lVar5 = lVar5 + 1) {
        local_398 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&primal,&local_398,(type *)0x0);
        bVar4 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)((long)&(pnVar3->m_backend).m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar10),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&primal);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&primal);
        if (bVar4) {
          poVar6 = std::operator<<((ostream *)&outfile,
                                   colnames->mem +
                                   (colnames->set).theitem[(colnames->set).thekey[lVar5].idx].data);
          poVar6 = std::operator<<(poVar6,"\t");
          poVar6 = boost::multiprecision::operator<<
                             (poVar6,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)((long)&((primal_1.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                m_backend).m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar10));
          std::endl<char,std::char_traits<char>>(poVar6);
          iVar2 = iVar2 + 1;
        }
        lVar10 = lVar10 + 0x40;
      }
      poVar6 = std::operator<<((ostream *)&outfile,"All other variables are zero. Solution has ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," nonzero entries.");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      std::operator<<((ostream *)&outfile,"No primal (rational) solution available.\n");
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector(&primal_1.val);
  }
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}